

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2cfb1b::SymlinkCommand::execute
          (SymlinkCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context,
          ResultFn *resultFn)

{
  long *plVar1;
  long *plVar2;
  BuildSystemDelegate *pBVar3;
  TaskInterface ti_00;
  char cVar4;
  BuildSystemImpl *pBVar5;
  size_type sVar6;
  ArrayRef<llbuild::basic::FileInfo> outputInfos;
  StringRef path;
  StringRef outputPath;
  BuildValue local_110;
  FileInfo outputInfo;
  string local_50;
  
  outputPath = getActualOutputPath(this);
  if ((char *)outputPath.Length == (char *)0x0 ||
      (this->super_Command).outputs.
      super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->super_Command).outputs.
      super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_110.kind = FailedCommand;
    local_110.numOutputInfos = 0;
    local_110.signature.value._0_4_ = 0;
    local_110.signature.value._4_4_ = 0;
    local_110.valueData.asOutputInfo.device._0_4_ = 0;
    local_110.valueData._4_8_ = 0;
    local_110.valueData._12_8_ = 0;
    local_110.valueData._20_8_ = 0;
    local_110.valueData._28_8_ = 0;
    local_110.valueData._36_8_ = 0;
    local_110.valueData._44_8_ = 0;
    local_110.valueData._52_8_ = 0;
    local_110.valueData._60_8_ = 0;
    local_110.valueData._68_8_ = 0;
    local_110.valueData._76_4_ = 0;
    local_110.stringValues.contents._0_4_ = 0;
    local_110.stringValues.contents._4_4_ = 0;
    local_110.stringValues.size = 0;
    std::function<void_(llbuild::buildsystem::BuildValue_&&)>::operator()(resultFn,&local_110);
    goto LAB_0017b400;
  }
  plVar1 = *(long **)((long)system->impl + 0x10);
  sVar6 = 2;
  path.Length = 2;
  path.Data = (char *)outputPath.Length;
  outputInfo._0_16_ = llvm::sys::path::parent_path((path *)outputPath.Data,path,native);
  if (outputInfo.inode != 0) {
    llvm::StringRef::str_abi_cxx11_((string *)&local_110,(StringRef *)&outputInfo);
    (**(code **)(*plVar1 + 0x18))(plVar1,&local_110);
    std::__cxx11::string::_M_dispose();
  }
  plVar2 = *(long **)((long)system->impl + 8);
  (**(code **)(*plVar2 + 0x50))(plVar2,this);
  llvm::StringRef::str_abi_cxx11_((string *)&local_110,&outputPath);
  cVar4 = (**(code **)(*plVar1 + 0x48))(plVar1,&this->contents,&local_110);
  std::__cxx11::string::_M_dispose();
  if (cVar4 == '\0') {
    llvm::StringRef::str_abi_cxx11_((string *)&local_110,&outputPath);
    (**(code **)(*plVar1 + 0x28))(plVar1,&local_110);
    std::__cxx11::string::_M_dispose();
    llvm::StringRef::str_abi_cxx11_((string *)&local_110,&outputPath);
    cVar4 = (**(code **)(*plVar1 + 0x48))(plVar1,&this->contents,&local_110);
    std::__cxx11::string::_M_dispose();
    if (cVar4 != '\0') goto LAB_0017b2c2;
    ti_00.ctx = outputPath.Data;
    ti_00.impl = resultFn;
    pBVar5 = getBuildSystem(ti_00);
    pBVar3 = pBVar5->delegate;
    llvm::StringRef::str_abi_cxx11_(&local_50,&outputPath);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outputInfo,
                   "unable to create symlink at \'",&local_50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outputInfo,
                   "\'");
    (*pBVar3->_vptr_BuildSystemDelegate[0xb])
              (pBVar3,this,CONCAT44(local_110.numOutputInfos,local_110.kind),
               CONCAT44(local_110.signature.value._4_4_,(undefined4)local_110.signature.value));
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    plVar1 = *(long **)((long)system->impl + 8);
    (**(code **)(*plVar1 + 0x70))(plVar1,this,1);
    local_110.kind = FailedCommand;
    local_110.numOutputInfos = 0;
    local_110.signature.value._0_4_ = 0;
    local_110.signature.value._4_4_ = 0;
    local_110.valueData.asOutputInfo.device._0_4_ = 0;
    local_110.valueData._4_8_ = 0;
    local_110.valueData._12_8_ = 0;
    local_110.valueData._20_8_ = 0;
    local_110.valueData._28_8_ = 0;
    local_110.valueData._36_8_ = 0;
    local_110.valueData._44_8_ = 0;
    local_110.valueData._52_8_ = 0;
    local_110.valueData._60_8_ = 0;
    local_110.valueData._68_8_ = 0;
    local_110.valueData._76_4_ = 0;
    local_110.stringValues.contents._0_4_ = 0;
    local_110.stringValues.contents._4_4_ = 0;
    local_110.stringValues.size = 0;
  }
  else {
LAB_0017b2c2:
    plVar2 = *(long **)((long)system->impl + 8);
    (**(code **)(*plVar2 + 0x70))(plVar2,this,0);
    llvm::StringRef::str_abi_cxx11_((string *)&local_110,&outputPath);
    (**(code **)(*plVar1 + 0x40))((BuildValue *)&outputInfo,plVar1,&local_110);
    std::__cxx11::string::_M_dispose();
    outputInfos.Length = sVar6;
    outputInfos.Data = (FileInfo *)0x1;
    llbuild::buildsystem::BuildValue::makeSuccessfulCommand
              (&local_110,(BuildValue *)&outputInfo,outputInfos);
  }
  std::function<void_(llbuild::buildsystem::BuildValue_&&)>::operator()(resultFn,&local_110);
LAB_0017b400:
  llbuild::buildsystem::BuildValue::~BuildValue(&local_110);
  return;
}

Assistant:

virtual void execute(BuildSystem& system,
                       TaskInterface ti,
                       QueueJobContext* context,
                       ResultFn resultFn) override {
    // It is an error if this command isn't configured properly.
    StringRef outputPath = getActualOutputPath();
    if (outputs.empty() || outputPath.empty()) {
      resultFn(BuildValue::makeFailedCommand());
      return;
    }

    auto& fs = system.getFileSystem();

    // Create the directory containing the symlink, if necessary.
    //
    // FIXME: Shared behavior with ExternalCommand.
    {
      auto parent = llvm::sys::path::parent_path(outputPath);
      if (!parent.empty()) {
        (void) fs.createDirectories(parent);
      }
    }

    // Create the symbolic link (note that despite the poorly chosen LLVM
    // name, this is a symlink).
    system.getDelegate().commandStarted(this);
    auto success = true;
    if (!fs.createSymlink(contents, outputPath.str())) {
      // On failure, we attempt to unlink the file and retry.
      fs.remove(outputPath.str());

      if (!fs.createSymlink(contents, outputPath.str())) {
        getBuildSystem(ti).getDelegate().commandHadError(this,
                       "unable to create symlink at '" + outputPath.str() + "'");
        success = false;
      }
    }
    system.getDelegate().commandFinished(this, success ? ProcessStatus::Succeeded : ProcessStatus::Failed);
    
    // Process the result.
    if (!success) {
      resultFn(BuildValue::makeFailedCommand());
      return;
    }

    // Capture the *link* information of the output.
    FileInfo outputInfo = fs.getLinkInfo(outputPath);
      
    // Complete with a successful result.
    resultFn(BuildValue::makeSuccessfulCommand(outputInfo));
  }